

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

Mat3x3d * __thiscall
OpenMD::Thermo::getSystemQuadrupole(Mat3x3d *__return_storage_ptr__,Thermo *this)

{
  Snapshot *this_00;
  bool bVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  Atom *this_01;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  FluctuatingChargeAdapter fqa;
  MoleculeIterator miter;
  Vector3d dipole;
  Mat3x3d qpole;
  Vector3d ri;
  double local_1c8;
  MultipoleAdapter local_1b8;
  FixedChargeAdapter local_1b0;
  Mat3x3d *local_1a8;
  Thermo *local_1a0;
  Molecule *local_198;
  FluctuatingChargeAdapter local_190;
  MoleculeIterator local_188;
  Vector<double,_3U> local_180;
  RectMatrix<double,_3U,_3U> local_168;
  Vector<double,_3U> local_120;
  RectMatrix<double,_3U,_3U> local_108;
  RectMatrix<double,_3U,_3U> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasSystemQuadrupole == false) {
    local_188._M_node = (_Base_ptr)0x0;
    local_108.data_[0][0] = 0.0;
    local_1a8 = __return_storage_ptr__;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_168,(double *)&local_108);
    Vector<double,_3U>::Vector(&local_120,(Vector<double,_3U> *)&local_168);
    local_108.data_[0][0] = 0.0;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_168,(double *)&local_108);
    Vector<double,_3U>::Vector(&local_180,(Vector<double,_3U> *)&local_168);
    RectMatrix<double,_3U,_3U>::RectMatrix(&local_168,0.0);
    pMVar2 = SimInfo::beginMolecule(this->info_,&local_188);
    local_1a0 = this;
    while (pMVar2 != (Molecule *)0x0) {
      ppAVar3 = (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_198 = pMVar2;
      if (ppAVar3 !=
          (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_0018d70e;
      this_01 = (Atom *)0x0;
      while (this_01 != (Atom *)0x0) {
        StuntDouble::getPos((Vector3d *)&local_108,&this_01->super_StuntDouble);
        Vector<double,_3U>::operator=(&local_120,(Vector<double,_3U> *)&local_108);
        Snapshot::wrapVector(this_00,(Vector3d *)&local_120);
        Vector<double,_3U>::mul(&local_120,1e-10);
        local_1b0.at_ = this_01->atomType_;
        bVar1 = FixedChargeAdapter::isFixedCharge(&local_1b0);
        local_1c8 = 0.0;
        if (bVar1) {
          local_1c8 = FixedChargeAdapter::getCharge(&local_1b0);
        }
        local_190.at_ = this_01->atomType_;
        bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_190);
        if (bVar1) {
          local_1c8 = local_1c8 +
                      *(double *)
                       (*(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->
                                          currentSnapshot_->atomData).flucQPos.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start +
                                 (this_01->super_StuntDouble).storage_) +
                       (long)(this_01->super_StuntDouble).localIndex_ * 8);
        }
        outProduct<double>((SquareMatrix3<double> *)&local_78,(Vector3<double> *)&local_120,
                           (Vector3<double> *)&local_120);
        operator*(&local_108,local_1c8 * 1.60217733e-19 * 0.5,&local_78);
        RectMatrix<double,_3U,_3U>::add(&local_168,&local_108);
        local_1b8.at_ = this_01->atomType_;
        bVar1 = MultipoleAdapter::isDipole(&local_1b8);
        if (bVar1) {
          StuntDouble::getDipole((Vector3d *)&local_78,&this_01->super_StuntDouble);
          operator*((Vector<double,_3U> *)&local_108,(Vector<double,_3U> *)&local_78,
                    3.33564095198e-30);
          Vector3<double>::operator=((Vector3<double> *)&local_180,(Vector<double,_3U> *)&local_108)
          ;
          outProduct<double>((SquareMatrix3<double> *)&local_78,(Vector3<double> *)&local_180,
                             (Vector3<double> *)&local_120);
          operator*(&local_108,0.5,&local_78);
          RectMatrix<double,_3U,_3U>::add(&local_168,&local_108);
          outProduct<double>((SquareMatrix3<double> *)&local_78,(Vector3<double> *)&local_120,
                             (Vector3<double> *)&local_180);
          operator*(&local_108,0.5,&local_78);
          RectMatrix<double,_3U,_3U>::add(&local_168,&local_108);
        }
        bVar1 = MultipoleAdapter::isQuadrupole(&local_1b8);
        if (bVar1) {
          StuntDouble::getQuadrupole((Mat3x3d *)&local_c0,&this_01->super_StuntDouble);
          operator*(&local_78,&local_c0,3.33564095198e-30);
          operator*(&local_108,&local_78,1e-10);
          RectMatrix<double,_3U,_3U>::add(&local_168,&local_108);
        }
        ppAVar3 = ppAVar3 + 1;
        this_01 = (Atom *)0x0;
        if (ppAVar3 !=
            (local_198->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_0018d70e:
          this_01 = *ppAVar3;
        }
      }
      pMVar2 = SimInfo::nextMolecule(local_1a0->info_,&local_188);
    }
    Snapshot::setSystemQuadrupole(this_00,(Mat3x3d *)&local_168);
    __return_storage_ptr__ = local_1a8;
  }
  Snapshot::getSystemQuadrupole(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Thermo::getSystemQuadrupole() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasSystemQuadrupole) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      Vector3d ri(0.0);
      Vector3d dipole(0.0);
      Mat3x3d qpole(0.0);

      RealType chargeToC   = 1.60217733e-19;
      RealType angstromToM = 1.0e-10;
      RealType debyeToCm   = 3.33564095198e-30;

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          ri = atom->getPos();
          snap->wrapVector(ri);
          ri *= angstromToM;

          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          charge *= chargeToC;

          qpole += 0.5 * charge * outProduct(ri, ri);

          MultipoleAdapter ma = MultipoleAdapter(atom->getAtomType());

          if (ma.isDipole()) {
            dipole = atom->getDipole() * debyeToCm;
            qpole += 0.5 * outProduct(dipole, ri);
            qpole += 0.5 * outProduct(ri, dipole);
          }

          if (ma.isQuadrupole()) {
            qpole += atom->getQuadrupole() * debyeToCm * angstromToM;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, qpole.getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setSystemQuadrupole(qpole);
    }

    return snap->getSystemQuadrupole();
  }